

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O3

void Eigen::internal::
     partial_lu_inplace<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpositions<_1,_1,int>>
               (Matrix<double,__1,__1,_0,__1,__1> *lu,
               Transpositions<_1,__1,_int> *row_transpositions,Index *nb_transpositions)

{
  long cols;
  Index rows;
  
  cols = (lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (cols == (int)(row_transpositions->m_indices).
                   super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    rows = (lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    partial_lu_impl<double,_0,_int>::blocked_lu
              (rows,cols,
               (lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data,rows,
               (row_transpositions->m_indices).
               super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data,
               nb_transpositions,0x100);
    return;
  }
  __assert_fail("lu.cols() == row_transpositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/LU/PartialPivLU.h"
                ,0x178,
                "void Eigen::internal::partial_lu_inplace(MatrixType &, TranspositionType &, typename TranspositionType::Index &) [MatrixType = Eigen::Matrix<double, -1, -1>, TranspositionType = Eigen::Transpositions<-1, -1>]"
               );
}

Assistant:

void partial_lu_inplace(MatrixType& lu, TranspositionType& row_transpositions, typename TranspositionType::Index& nb_transpositions)
{
  eigen_assert(lu.cols() == row_transpositions.size());
  eigen_assert((&row_transpositions.coeffRef(1)-&row_transpositions.coeffRef(0)) == 1);

  partial_lu_impl
    <typename MatrixType::Scalar, MatrixType::Flags&RowMajorBit?RowMajor:ColMajor, typename TranspositionType::Index>
    ::blocked_lu(lu.rows(), lu.cols(), &lu.coeffRef(0,0), lu.outerStride(), &row_transpositions.coeffRef(0), nb_transpositions);
}